

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O0

void VP8LCreateHuffmanTree
               (uint32_t *histogram,int tree_depth_limit,uint8_t *buf_rle,HuffmanTree *huff_tree,
               HuffmanTreeCode *huff_code)

{
  void *in_RDX;
  undefined4 in_ESI;
  uint8_t *in_RDI;
  int *in_R8;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int num_symbols;
  HuffmanTreeCode *in_stack_00000060;
  undefined4 in_stack_fffffffffffffff0;
  
  memset(in_RDX,0,(long)*in_R8);
  OptimizeHuffmanForRle
            (unaff_retaddr_00,in_RDI,(uint32_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  GenerateOptimalTree((uint32_t *)buf_rle,huff_tree._4_4_,(HuffmanTree *)huff_code,num_symbols,
                      (uint8_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  ConvertBitDepthsToSymbols(in_stack_00000060);
  return;
}

Assistant:

void VP8LCreateHuffmanTree(uint32_t* const histogram, int tree_depth_limit,
                           uint8_t* const buf_rle, HuffmanTree* const huff_tree,
                           HuffmanTreeCode* const huff_code) {
  const int num_symbols = huff_code->num_symbols;
  memset(buf_rle, 0, num_symbols * sizeof(*buf_rle));
  OptimizeHuffmanForRle(num_symbols, buf_rle, histogram);
  GenerateOptimalTree(histogram, num_symbols, huff_tree, tree_depth_limit,
                      huff_code->code_lengths);
  // Create the actual bit codes for the bit lengths.
  ConvertBitDepthsToSymbols(huff_code);
}